

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_select(roaring_bitmap_t *bm,uint32_t rank,uint32_t *element)

{
  int iVar1;
  uint8_t uVar2;
  _Bool _Var3;
  uint in_EAX;
  uint64_t *puVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  bitset_container_t *container;
  long lVar8;
  uint32_t uVar9;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  iVar1 = (bm->high_low_container).size;
  bVar7 = 0 < iVar1;
  if (0 < iVar1) {
    lVar8 = 0;
    do {
      container = (bitset_container_t *)(bm->high_low_container).containers[lVar8];
      uVar2 = (bm->high_low_container).typecodes[lVar8];
      if (uVar2 == '\x04') {
        uVar2 = *(uint8_t *)&container->words;
        if (uVar2 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        container = *(bitset_container_t **)container;
      }
      if (uVar2 == '\x03') {
        lVar5 = (long)container->cardinality;
        if (0 < lVar5) {
          puVar4 = container->words;
          uVar6 = (uint)*(ushort *)((long)puVar4 + 2) + uStack_38._4_4_;
          while( true ) {
            if (rank <= uVar6) {
              uVar9 = (rank - uStack_38._4_4_) + (uint)(ushort)*puVar4;
              goto LAB_0011be06;
            }
            lVar5 = lVar5 + -1;
            uStack_38._4_4_ = uVar6 + 1;
            if (lVar5 == 0) break;
            uVar6 = (uint)*(ushort *)((long)puVar4 + 6) + uStack_38._4_4_;
            puVar4 = (uint64_t *)((long)puVar4 + 4);
          }
        }
      }
      else if (uVar2 == '\x02') {
        uVar6 = container->cardinality + uStack_38._4_4_;
        if (rank < uVar6) {
          uVar9 = (uint32_t)
                  *(ushort *)((long)container->words + (ulong)(rank - uStack_38._4_4_) * 2);
LAB_0011be06:
          *element = uVar9;
          goto code_r0x0011bd8b;
        }
        uStack_38 = CONCAT44(uVar6,(undefined4)uStack_38);
      }
      else {
        if (uVar2 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x18b0,
                        "_Bool container_select(const container_t *, uint8_t, uint32_t *, uint32_t, uint32_t *)"
                       );
        }
        _Var3 = bitset_container_select(container,(uint32_t *)((long)&uStack_38 + 4),rank,element);
        if (_Var3) {
code_r0x0011bd8b:
          *element = *element |
                     (uint)(bm->high_low_container).keys[(lVar8 + 1U & 0xffffffff) - 1] << 0x10;
          return bVar7;
        }
      }
      lVar8 = lVar8 + 1;
      lVar5 = (long)(bm->high_low_container).size;
      bVar7 = lVar8 < lVar5;
    } while (lVar8 < lVar5);
  }
  return bVar7;
}

Assistant:

bool roaring_bitmap_select(const roaring_bitmap_t *bm, uint32_t rank,
                           uint32_t *element) {
    container_t *container;
    uint8_t typecode;
    uint16_t key;
    uint32_t start_rank = 0;
    int i = 0;
    bool valid = false;
    while (!valid && i < bm->high_low_container.size) {
        container = bm->high_low_container.containers[i];
        typecode = bm->high_low_container.typecodes[i];
        valid =
            container_select(container, typecode, &start_rank, rank, element);
        i++;
    }

    if (valid) {
        key = bm->high_low_container.keys[i - 1];
        *element |= (((uint32_t)key) << 16);  // w/o cast, key promotes signed
        return true;
    } else
        return false;
}